

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall
CTcSymMetaclassBase::add_prop
          (CTcSymMetaclassBase *this,char *txt,size_t len,char *obj_fname,int is_static)

{
  tctarg_prop_id_t prop;
  CTcSymProp *this_00;
  char *siz;
  
  siz = txt;
  this_00 = (CTcSymProp *)CTcPrsSymtab::find(G_prs->global_symtab_,txt,len);
  if (this_00 == (CTcSymProp *)0x0) {
    this_00 = (CTcSymProp *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x30,(size_t)siz);
    prop = G_cg->next_prop_;
    G_cg->next_prop_ = prop + 1;
    CTcSymProp::CTcSymProp(this_00,txt,len,0,prop);
    (*G_prs->global_symtab_->_vptr_CTcPrsSymtab[3])(G_prs->global_symtab_,this_00);
  }
  else if (*(int *)&((CVmHashEntry *)
                    &(this_00->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase)->
                    field_0x24 != 3) {
    if (obj_fname != (char *)0x0) {
      CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2e1c,len & 0xffffffff,txt,
                         "property",obj_fname);
      return;
    }
    CTcTokenizer::log_error_curtok(G_tok,0x2b63);
    return;
  }
  (*(this_00->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
    super_CVmHashEntry._vptr_CVmHashEntry[0xf])(this_00);
  add_prop(this,this_00,is_static);
  return;
}

Assistant:

void CTcSymMetaclassBase::add_prop(
    const char *txt, size_t len, const char *obj_fname, int is_static)
{
    /* see if this property is already defined */
    CTcSymProp *prop_sym =
        (CTcSymProp *)G_prs->get_global_symtab()->find(txt, len);
    if (prop_sym != 0)
    {
        /* it's already defined - make sure it's a property */
        if (prop_sym->get_type() != TC_SYM_PROP)
        {
            /* 
             *   it's something other than a property - log the
             *   appropriate type of error, depending on whether we're
             *   loading this from an object file or from source code 
             */
            if (obj_fname == 0)
            {
                /* creating from source - note the code location */
                G_tok->log_error_curtok(TCERR_REDEF_AS_PROP);
            }
            else
            {
                /* loading from an object file */
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_OBJFILE_REDEF_SYM_TYPE,
                                    (int)len, txt, "property", obj_fname);
            }

            /* forget the symbol - it's not a property */
            prop_sym = 0;
        }
    }
    else
    {
        /* add the property definition */
        prop_sym = new CTcSymProp(txt, len, FALSE, G_cg->new_prop_id());
        G_prs->get_global_symtab()->add_entry(prop_sym);
    }

    /* 
     *   if we found a valid property symbol, add it to the metaclass
     *   property list 
     */
    if (prop_sym != 0)
    {
        /* 
         *   mark the symbol as referenced - even if we don't directly
         *   make use of it, the metaclass table references this symbol 
         */
        prop_sym->mark_referenced();
        
        /* add the property to the metaclass list */
        add_prop(prop_sym, is_static);
    }
}